

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KnightBoard.cpp
# Opt level: O2

void __thiscall KnightBoard::printBoard(KnightBoard *this)

{
  uint uVar1;
  Square *pSVar2;
  uint i;
  uint row;
  char *pcVar3;
  ostream *poVar4;
  uint j;
  uint col;
  
  for (row = 0; uVar1 = this->size, row < uVar1; row = row + 1) {
    for (col = 0; col < uVar1; col = col + 1) {
      pSVar2 = getSquare(this,row,col);
      if (pSVar2->containsKnight == true) {
        poVar4 = (ostream *)&std::cout;
        pcVar3 = "K ";
      }
      else {
        pSVar2 = getSquare(this,row,col);
        poVar4 = std::operator<<((ostream *)&std::cout,pSVar2->symbol);
        pcVar3 = " ";
      }
      std::operator<<(poVar4,pcVar3);
      uVar1 = this->size;
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void KnightBoard::printBoard() {
    for (unsigned int i = 0; i < size; i++) {
        for (unsigned int j = 0; j < size; j++) {
            if(this->getSquare(i,j)->containsKnight)
                cout<<"K ";
            else
                cout << this->getSquare(i, j)->symbol<<" ";
        }
        cout << endl;
    }
    cout << endl;
}